

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<unsigned_char> * cimg_library::CImg<unsigned_char>::default_LUT256(void)

{
  uint r;
  uint uVar1;
  uint uVar2;
  uint g;
  uint uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  
  if (default_LUT256()::colormap == '\0') {
    iVar5 = __cxa_guard_acquire(&default_LUT256()::colormap);
    if (iVar5 != 0) {
      default_LUT256::colormap._data = (uchar *)0x0;
      default_LUT256::colormap._width = 0;
      default_LUT256::colormap._height = 0;
      default_LUT256::colormap._depth = 0;
      default_LUT256::colormap._spectrum = 0;
      default_LUT256::colormap._is_shared = false;
      __cxa_atexit(~CImg,&default_LUT256::colormap,&__dso_handle);
      __cxa_guard_release(&default_LUT256()::colormap);
    }
  }
  cimg::mutex(8,1);
  if (default_LUT256::colormap._data == (uchar *)0x0) {
    assign(&default_LUT256::colormap,1,0x100,1,3);
    uVar2 = 0;
    for (uVar1 = 0x10; uVar1 < 0x100; uVar1 = uVar1 + 0x20) {
      for (uVar3 = 0x10; uVar3 < 0x100; uVar3 = uVar3 + 0x20) {
        uVar4 = uVar2 + 4;
        for (iVar5 = -0x100; iVar5 != 0; iVar5 = iVar5 + 0x40) {
          uVar6 = (ulong)uVar2;
          default_LUT256::colormap._data[(default_LUT256::colormap._0_8_ & 0xffffffff) * uVar6] =
               (uchar)uVar1;
          default_LUT256::colormap._data
          [((ulong)default_LUT256::colormap._0_8_ >> 0x20) *
           (default_LUT256::colormap._0_8_ & 0xffffffff) +
           (default_LUT256::colormap._0_8_ & 0xffffffff) * uVar6] = (uchar)uVar3;
          uVar2 = uVar2 + 1;
          default_LUT256::colormap._data
          [((ulong)default_LUT256::colormap._0_8_ >> 0x20) *
           (default_LUT256::colormap._0_8_ & 0xffffffff) * 2 +
           uVar6 * (default_LUT256::colormap._0_8_ & 0xffffffff)] = (char)iVar5 + ' ';
        }
        uVar2 = uVar4;
      }
    }
  }
  cimg::mutex(8,0);
  return &default_LUT256::colormap;
}

Assistant:

static const CImg<Tuchar>& default_LUT256() {
      static CImg<Tuchar> colormap;
      cimg::mutex(8);
      if (!colormap) {
        colormap.assign(1,256,1,3);
        for (unsigned int index = 0, r = 16; r<256; r+=32)
          for (unsigned int g = 16; g<256; g+=32)
            for (unsigned int b = 32; b<256; b+=64) {
              colormap(0,index,0) = (Tuchar)r;
              colormap(0,index,1) = (Tuchar)g;
              colormap(0,index++,2) = (Tuchar)b;
            }
      }
      cimg::mutex(8,0);
      return colormap;
    }